

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O2

void __thiscall
cmCPackIFWResourcesParser::~cmCPackIFWResourcesParser(cmCPackIFWResourcesParser *this)

{
  (this->super_cmXMLParser)._vptr_cmXMLParser =
       (_func_int **)&PTR__cmCPackIFWResourcesParser_005db4e0;
  std::__cxx11::string::~string((string *)&this->basePath);
  std::__cxx11::string::~string((string *)&this->path);
  cmXMLParser::~cmXMLParser(&this->super_cmXMLParser);
  return;
}

Assistant:

cmCPackIFWResourcesParser(cmCPackIFWInstaller* i)
    : installer(i)
    , file(false)
  {
    this->path = i->Directory + "/resources";
  }